

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  uint *puVar1;
  U32 *pUVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 UVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  UVar7 = size + 0xf;
  if (-1 < (int)size) {
    UVar7 = size;
  }
  if ((size & 0xf) == 0) {
    if (-1 < (int)size) {
      if (0xf < (int)size) {
        uVar8 = reducerValue + 2;
        lVar10 = 0;
        iVar11 = 0;
        do {
          lVar9 = (long)(int)lVar10;
          lVar10 = lVar9 + 0x10;
          lVar12 = 0;
          do {
            puVar1 = table + lVar9 + lVar12;
            uVar3 = *puVar1;
            uVar4 = puVar1[1];
            uVar5 = puVar1[2];
            uVar6 = puVar1[3];
            pUVar2 = table + lVar9 + lVar12;
            *pUVar2 = -(uint)(((uVar3 < uVar8) * uVar8 | (uVar3 >= uVar8) * uVar3) == uVar3) &
                      uVar3 - reducerValue;
            pUVar2[1] = -(uint)(((uVar4 < uVar8) * uVar8 | (uVar4 >= uVar8) * uVar4) == uVar4) &
                        uVar4 - reducerValue;
            pUVar2[2] = -(uint)(((uVar5 < uVar8) * uVar8 | (uVar5 >= uVar8) * uVar5) == uVar5) &
                        uVar5 - reducerValue;
            pUVar2[3] = -(uint)(((uVar6 < uVar8) * uVar8 | (uVar6 >= uVar8) * uVar6) == uVar6) &
                        uVar6 - reducerValue;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          iVar11 = iVar11 + 1;
        } while (iVar11 != (int)UVar7 >> 4);
      }
      return;
    }
    __assert_fail("size < (1U<<31)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5abd,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5abc,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}